

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadCodeElimination.cpp
# Opt level: O2

void __thiscall
wasm::DeadCodeElimination::visitExpression(DeadCodeElimination *this,Expression *curr)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Id IVar1;
  ArenaVector<wasm::Expression_*> *pAVar2;
  byte bVar3;
  bool bVar4;
  Index IVar5;
  uint uVar6;
  Expression **ppEVar7;
  long lVar8;
  Block *expression;
  ulong extraout_RDX;
  Builder BVar9;
  Expression *expression_00;
  uint uVar10;
  Iterator IVar11;
  optional<wasm::Type> type;
  undefined1 local_c0 [8];
  Iterator __begin6;
  _Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_98;
  Expression *local_80;
  Expression *child;
  Builder local_70;
  Builder builder;
  Index local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> remainingChildren;
  
  IVar1 = curr->_id;
  if (IVar1 == BlockId) {
    this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(curr + 2);
    uVar10 = 0;
    do {
      if (curr[2].type.id <= (ulong)uVar10) goto LAB_009cb256;
      ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (this_00,(ulong)uVar10);
      uVar10 = uVar10 + 1;
    } while (((*ppEVar7)->type).id != 1);
    if (uVar10 != 0) {
      for (uVar6 = uVar10; (ulong)uVar6 < curr[2].type.id; uVar6 = uVar6 + 1) {
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (this_00,(ulong)uVar6);
        TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,*ppEVar7);
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                (this_00,(ulong)uVar10);
      if ((curr[2].type.id == 1) &&
         (ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (this_00,0), (*ppEVar7)->_id == UnreachableId)) {
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (this_00,0);
        expression_00 = *ppEVar7;
        goto LAB_009cb062;
      }
    }
LAB_009cb256:
    if ((curr->type).id < 2) {
      return;
    }
    ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back(this_00);
    if (((*ppEVar7)->type).id != 1) {
      return;
    }
    bVar4 = TypeUpdater::hasBreaks(&this->typeUpdater,(Block *)curr);
    if (bVar4) {
      return;
    }
  }
  else {
    if (IVar1 == IfId) {
      if (*(long *)(*(long *)(curr + 1) + 8) == 1) {
        TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,(Expression *)curr[1].type.id);
        if (*(Expression **)(curr + 2) != (Expression *)0x0) {
          TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,*(Expression **)(curr + 2));
        }
        expression_00 = *(Expression **)(curr + 1);
        goto LAB_009cb062;
      }
      if ((curr->type).id == 1) {
        return;
      }
      lVar8 = *(long *)(curr + 2);
      if (lVar8 == 0) {
        return;
      }
      if (*(long *)(curr[1].type.id + 8) != 1) {
        return;
      }
    }
    else {
      if (IVar1 == LoopId) {
        expression_00 = *(Expression **)(curr + 2);
        if (expression_00->_id != UnreachableId) {
          return;
        }
LAB_009cb062:
        replaceCurrent(this,expression_00);
        return;
      }
      if (IVar1 != TryTableId) {
        if (IVar1 == TryId) {
          __begin6.parent = (ArenaVector<wasm::Expression_*> *)0x0;
          pAVar2 = *(ArenaVector<wasm::Expression_*> **)(curr + 5);
          bVar3 = 1;
          local_c0 = (undefined1  [8])&curr[4].type;
          while ((__begin6.parent != pAVar2 || (local_c0 != (undefined1  [8])&curr[4].type))) {
            ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator
                      ::operator*((Iterator *)local_c0);
            bVar3 = bVar3 & ((*ppEVar7)->type).id == 1;
            __begin6.parent =
                 (ArenaVector<wasm::Expression_*> *)
                 ((long)&((__begin6.parent)->
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
                         .data + 1);
          }
          if ((curr->type).id == 1) {
            return;
          }
          if (!(bool)(*(long *)(*(long *)(curr + 2) + 8) == 1 & bVar3)) {
            return;
          }
          TypeUpdater::changeType(&this->typeUpdater,curr,(Type)0x1);
          return;
        }
        if (IVar1 == PopId) {
          this->hasPop = true;
        }
        if ((curr->type).id != 1) {
          return;
        }
        AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                  ((AbstractChildIterator<wasm::ChildIterator> *)local_c0,curr);
        remainingChildren.
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)remainingChildren.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
        auStack_58 = (undefined1  [8])local_c0;
        IVar11 = AbstractChildIterator<wasm::ChildIterator>::end
                           ((AbstractChildIterator<wasm::ChildIterator> *)local_c0);
        IVar5 = (Index)remainingChildren.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        while ((IVar5 != IVar11.index || (auStack_58 != (undefined1  [8])IVar11.parent))) {
          ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                              ((Iterator *)auStack_58);
          if (((*ppEVar7)->type).id == 1) {
            std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
            ~_Vector_base(&local_98);
            local_70.wasm =
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>_>
                 ).
                 super_PostWalker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                 .
                 super_Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                 .currModule;
            auStack_58 = (undefined1  [8])0x0;
            remainingChildren.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            remainingChildren.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                      ((AbstractChildIterator<wasm::ChildIterator> *)local_c0,curr);
            local_60 = 0;
            builder.wasm = (Module *)local_c0;
            IVar11 = AbstractChildIterator<wasm::ChildIterator>::end
                               ((AbstractChildIterator<wasm::ChildIterator> *)local_c0);
            bVar4 = false;
            BVar9.wasm = (Module *)local_c0;
            while ((local_60 != IVar11.index || (BVar9.wasm != (Module *)IVar11.parent))) {
              ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                                  ((Iterator *)&builder);
              local_80 = *ppEVar7;
              if (bVar4) {
                bVar4 = true;
                TypeUpdater::noteRecursiveRemoval(&this->typeUpdater,local_80);
              }
              else if ((local_80->type).id == 1) {
                bVar4 = true;
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           auStack_58,&local_80);
              }
              else {
                child = (Expression *)Builder::makeDrop(&local_70,local_80);
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58
                           ,&child);
                bVar4 = false;
              }
              local_60 = local_60 + 1;
              BVar9.wasm = builder.wasm;
            }
            std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
            ~_Vector_base(&local_98);
            if ((long)remainingChildren.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 == 8) {
              expression = (Block *)((SmallVector<wasm::Expression_**,_4UL> *)auStack_58)->usedFixed
              ;
            }
            else {
              this->addedBlock = true;
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   (_Storage<wasm::Type,_true>)extraout_RDX;
              expression = Builder::
                           makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                                     (&local_70,
                                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       *)auStack_58,type);
            }
            replaceCurrent(this,(Expression *)expression);
            std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
            ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_58);
            return;
          }
          IVar5 = (Index)remainingChildren.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1;
          remainingChildren.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(remainingChildren.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar5);
        }
        std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                  (&local_98);
        return;
      }
      if ((curr->type).id == 1) {
        return;
      }
      lVar8 = *(long *)(curr + 1);
    }
    if (*(long *)(lVar8 + 8) != 1) {
      return;
    }
  }
  TypeUpdater::changeType(&this->typeUpdater,curr,(Type)0x1);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    if (curr->is<Pop>()) {
      hasPop = true;
    }

    if (!Properties::isControlFlowStructure(curr)) {
      // Control flow structures require special handling, but others are
      // simple.
      if (curr->type == Type::unreachable) {
        // This may be dead code. Check if there is an unreachable child.
        bool hasUnreachableChild = false;
        for (auto* child : ChildIterator(curr)) {
          if (child->type == Type::unreachable) {
            hasUnreachableChild = true;
            break;
          }
        }
        if (hasUnreachableChild) {
          // This is indeed unreachable code, made unreachable by that child.
          Builder builder(*getModule());
          std::vector<Expression*> remainingChildren;
          bool afterUnreachable = false;
          for (auto* child : ChildIterator(curr)) {
            if (afterUnreachable) {
              typeUpdater.noteRecursiveRemoval(child);
              continue;
            }
            if (child->type == Type::unreachable) {
              remainingChildren.push_back(child);
              afterUnreachable = true;
            } else {
              remainingChildren.push_back(builder.makeDrop(child));
            }
          }
          if (remainingChildren.size() == 1) {
            replaceCurrent(remainingChildren[0]);
          } else {
            addedBlock = true;
            replaceCurrent(builder.makeBlock(remainingChildren));
          }
        }
      }
      return;
    }
    // This is a control flow structure.
    if (auto* block = curr->dynCast<Block>()) {
      auto& list = block->list;
      // The index from which to remove, which is one after the first
      // unreachable instruction. Note that 0 is not a valid value, so we can
      // use it as such.
      Index removeFromHere = 0;
      for (Index i = 0; i < list.size(); i++) {
        if (list[i]->type == Type::unreachable) {
          removeFromHere = i + 1;
          break;
        }
      }
      if (removeFromHere != 0) {
        for (Index i = removeFromHere; i < list.size(); i++) {
          typeUpdater.noteRecursiveRemoval(list[i]);
        }
        list.resize(removeFromHere);
        if (list.size() == 1 && list[0]->is<Unreachable>()) {
          replaceCurrent(list[0]);
          return;
        }
      }
      // Finally, if there is no need for a concrete type (which is when there
      // is one marked, but nothing breaks to it, and also the block does not
      // have a concrete value flowing out) then remove it, which may allow
      // more reduction.
      if (block->type.isConcrete() && list.back()->type == Type::unreachable &&
          !typeUpdater.hasBreaks(block)) {
        typeUpdater.changeType(block, Type::unreachable);
      }
    } else if (auto* iff = curr->dynCast<If>()) {
      if (iff->condition->type == Type::unreachable) {
        typeUpdater.noteRecursiveRemoval(iff->ifTrue);
        if (iff->ifFalse) {
          typeUpdater.noteRecursiveRemoval(iff->ifFalse);
        }
        replaceCurrent(iff->condition);
        return;
      }
      // If both arms are unreachable, there is no need for a concrete type,
      // which may allow more reduction.
      if (iff->type != Type::unreachable && iff->ifFalse &&
          iff->ifTrue->type == Type::unreachable &&
          iff->ifFalse->type == Type::unreachable) {
        typeUpdater.changeType(iff, Type::unreachable);
      }
    } else if (auto* loop = curr->dynCast<Loop>()) {
      // The loop body may have unreachable type if it branches back to the
      // loop top, for example. The only case we look for here is where we've
      // already removed the entire body as dead code.
      if (loop->body->is<Unreachable>()) {
        replaceCurrent(loop->body);
      }
    } else if (auto* tryy = curr->dynCast<Try>()) {
      // If both try body and catch body are unreachable, there is no need for a
      // concrete type, which may allow more reduction.
      bool allCatchesUnreachable = true;
      for (auto* catchBody : tryy->catchBodies) {
        allCatchesUnreachable &= catchBody->type == Type::unreachable;
      }
      if (tryy->type != Type::unreachable &&
          tryy->body->type == Type::unreachable && allCatchesUnreachable) {
        typeUpdater.changeType(tryy, Type::unreachable);
      }
    } else if (auto* tryTable = curr->dynCast<TryTable>()) {
      // try_table can finish normally only if its body finishes normally.
      if (tryTable->type != Type::unreachable &&
          tryTable->body->type == Type::unreachable) {
        typeUpdater.changeType(tryTable, Type::unreachable);
      }
    } else {
      WASM_UNREACHABLE("unimplemented DCE control flow structure");
    }
  }